

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_str.cpp
# Opt level: O1

void test_string_view<char8_t>(void)

{
  bool bVar1;
  long lVar2;
  size_t *psVar3;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *pbVar4;
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_178;
  AssertionHandler local_168;
  BinaryExpr<const_frozen::basic_string<char8_t>_&,_const_char8_t_(&)[23]> local_120;
  basic_string<char8_t> local_f0;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_e0;
  basic_string<char8_t> local_d0;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_b8;
  basic_string<char8_t> local_a8;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  psVar3 = &DAT_001d1748;
  pbVar4 = &local_e0;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    pbVar4->_M_len = *psVar3;
    psVar3 = psVar3 + 1;
    pbVar4 = (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&pbVar4->_M_str;
  }
  local_f0.data_ = local_b8._M_str;
  local_f0.size_ = local_b8._M_len;
  local_120.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1950b1;
  local_120.super_ITransientExpression.m_isBinaryExpression = true;
  local_120.super_ITransientExpression.m_result = false;
  local_120.super_ITransientExpression._10_6_ = 0;
  local_178.file =
       "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
  ;
  local_178.line = 0x43;
  Catch::StringRef::StringRef(&local_40,"letItGo == letitgo");
  Catch::AssertionHandler::AssertionHandler
            (&local_168,(StringRef *)&local_120,&local_178,local_40,Normal);
  local_178.file = (char *)&local_f0;
  Catch::ExprLhs<frozen::basic_string<char8_t>const&>::operator==
            ((BinaryExpr<const_frozen::basic_string<char8_t>_&,_const_char8_t_(&)[12]> *)&local_120,
             (ExprLhs<frozen::basic_string<char8_t>const&> *)&local_178,
             (char8_t (*) [12])"Let it go !");
  Catch::AssertionHandler::handleExpr(&local_168,&local_120.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_120.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_168);
  if (local_168.m_completed == false) {
    (*(local_168.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_120.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1950b1;
  local_120.super_ITransientExpression.m_isBinaryExpression = true;
  local_120.super_ITransientExpression.m_result = false;
  local_120.super_ITransientExpression._10_6_ = 0;
  local_178.file =
       "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
  ;
  local_178.line = 0x44;
  Catch::StringRef::StringRef(&local_50,"letItGo == letitgo_s");
  Catch::AssertionHandler::AssertionHandler
            (&local_168,(StringRef *)&local_120,&local_178,local_50,Normal);
  bVar1 = Catch::compareEqual<frozen::basic_string<char8_t>,frozen::basic_string<char8_t>>
                    (&local_f0,&local_a8);
  Catch::StringRef::StringRef((StringRef *)&local_178,"==");
  local_120.super_ITransientExpression.m_result = bVar1;
  local_120.super_ITransientExpression.m_isBinaryExpression = true;
  local_120.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001d1b28;
  local_120.m_op.m_start = local_178.file;
  local_120.m_op.m_size = local_178.line;
  local_120.m_lhs = &local_f0;
  local_120.m_rhs = (char8_t (*) [23])&local_a8;
  Catch::AssertionHandler::handleExpr(&local_168,&local_120.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_120.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_168);
  if (local_168.m_completed == false) {
    (*(local_168.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_120.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1950b1;
  local_120.super_ITransientExpression.m_isBinaryExpression = true;
  local_120.super_ITransientExpression.m_result = false;
  local_120.super_ITransientExpression._10_6_ = 0;
  local_178.file =
       "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
  ;
  local_178.line = 0x45;
  Catch::StringRef::StringRef(&local_60,"letItGo == letitgo_sv");
  Catch::AssertionHandler::AssertionHandler
            (&local_168,(StringRef *)&local_120,&local_178,local_60,Normal);
  bVar1 = Catch::
          compareEqual<frozen::basic_string<char8_t>,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
                    (&local_f0,&local_b8);
  Catch::StringRef::StringRef((StringRef *)&local_178,"==");
  local_120.super_ITransientExpression.m_result = bVar1;
  local_120.super_ITransientExpression.m_isBinaryExpression = true;
  local_120.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001d1ba8;
  local_120.m_op.m_start = local_178.file;
  local_120.m_op.m_size = local_178.line;
  local_120.m_lhs = &local_f0;
  local_120.m_rhs = (char8_t (*) [23])&local_b8;
  Catch::AssertionHandler::handleExpr(&local_168,&local_120.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_120.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_168);
  if (local_168.m_completed == false) {
    (*(local_168.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_f0.data_ = local_e0._M_str;
  local_f0.size_ = local_e0._M_len;
  local_120.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1950b1;
  local_120.super_ITransientExpression.m_isBinaryExpression = true;
  local_120.super_ITransientExpression.m_result = false;
  local_120.super_ITransientExpression._10_6_ = 0;
  local_178.file =
       "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
  ;
  local_178.line = 0x48;
  Catch::StringRef::StringRef(&local_70,"letItGo == letitgoletitgo");
  Catch::AssertionHandler::AssertionHandler
            (&local_168,(StringRef *)&local_120,&local_178,local_70,Normal);
  local_178.file = (char *)&local_f0;
  Catch::ExprLhs<frozen::basic_string<char8_t>const&>::operator==
            (&local_120,(ExprLhs<frozen::basic_string<char8_t>const&> *)&local_178,
             (char8_t (*) [23])"Let it go, let it go !");
  Catch::AssertionHandler::handleExpr(&local_168,&local_120.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_120.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_168);
  if (local_168.m_completed == false) {
    (*(local_168.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_120.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1950b1;
  local_120.super_ITransientExpression.m_isBinaryExpression = true;
  local_120.super_ITransientExpression.m_result = false;
  local_120.super_ITransientExpression._10_6_ = 0;
  local_178.file =
       "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
  ;
  local_178.line = 0x49;
  Catch::StringRef::StringRef(&local_80,"letItGo == letitgoletitgo_s");
  Catch::AssertionHandler::AssertionHandler
            (&local_168,(StringRef *)&local_120,&local_178,local_80,Normal);
  bVar1 = Catch::compareEqual<frozen::basic_string<char8_t>,frozen::basic_string<char8_t>>
                    (&local_f0,&local_d0);
  Catch::StringRef::StringRef((StringRef *)&local_178,"==");
  local_120.super_ITransientExpression.m_result = bVar1;
  local_120.super_ITransientExpression.m_isBinaryExpression = true;
  local_120.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001d1b28;
  local_120.m_op.m_start = local_178.file;
  local_120.m_op.m_size = local_178.line;
  local_120.m_lhs = &local_f0;
  local_120.m_rhs = (char8_t (*) [23])&local_d0;
  Catch::AssertionHandler::handleExpr(&local_168,&local_120.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_120.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_168);
  if (local_168.m_completed == false) {
    (*(local_168.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_120.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1950b1;
  local_120.super_ITransientExpression.m_isBinaryExpression = true;
  local_120.super_ITransientExpression.m_result = false;
  local_120.super_ITransientExpression._10_6_ = 0;
  local_178.file =
       "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
  ;
  local_178.line = 0x4a;
  Catch::StringRef::StringRef(&local_90,"letItGo == letitgoletitgo_sv");
  Catch::AssertionHandler::AssertionHandler
            (&local_168,(StringRef *)&local_120,&local_178,local_90,Normal);
  bVar1 = Catch::
          compareEqual<frozen::basic_string<char8_t>,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
                    (&local_f0,&local_e0);
  Catch::StringRef::StringRef((StringRef *)&local_178,"==");
  local_120.super_ITransientExpression.m_result = bVar1;
  local_120.super_ITransientExpression.m_isBinaryExpression = true;
  local_120.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001d1ba8;
  local_120.m_op.m_start = local_178.file;
  local_120.m_op.m_size = local_178.line;
  local_120.m_lhs = &local_f0;
  local_120.m_rhs = (char8_t (*) [23])&local_e0;
  Catch::AssertionHandler::handleExpr(&local_168,&local_120.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_120.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_168);
  if (local_168.m_completed == false) {
    (*(local_168.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  return;
}

Assistant:

void test_string_view() {
#ifdef FROZEN_LETITGO_HAS_STRING_VIEW
  constexpr auto strings = []() -> std::tuple<
    const Char(&)[12], frozen::basic_string<Char>, std::basic_string_view<Char>,
    const Char(&)[23], frozen::basic_string<Char>, std::basic_string_view<Char>
  > {
    if constexpr (std::is_same_v<char, Char>) {
      return {
        "Let it go !", "Let it go !"_s, "Let it go !"sv,
        "Let it go, let it go !", "Let it go, let it go !"_s, "Let it go, let it go !"sv
      };
    } else if constexpr (std::is_same_v<wchar_t, Char>) {
      return {
        L"Let it go !", L"Let it go !"_s, L"Let it go !"sv,
        L"Let it go, let it go !", L"Let it go, let it go !"_s, L"Let it go, let it go !"sv
      };
    } else if constexpr (std::is_same_v<char16_t, Char>) {
      return {
        u"Let it go !", u"Let it go !"_s, u"Let it go !"sv,
        u"Let it go, let it go !", u"Let it go, let it go !"_s, u"Let it go, let it go !"sv
      };
    } else if constexpr (std::is_same_v<char32_t, Char>) {
      return {
        U"Let it go !", U"Let it go !"_s, U"Let it go !"sv,
        U"Let it go, let it go !", U"Let it go, let it go !"_s, U"Let it go, let it go !"sv
      };
    }
#ifdef FROZEN_LETITGO_HAS_CHAR8T
    else if constexpr (std::is_same_v<char8_t, Char>) {
      return {
        u8"Let it go !", u8"Let it go !"_s, u8"Let it go !"sv,
        u8"Let it go, let it go !", u8"Let it go, let it go !"_s, u8"Let it go, let it go !"sv
      };
    }
#endif
  }();
  
  const auto [
    letitgo,
    letitgo_s,
    letitgo_sv,
    letitgoletitgo,
    letitgoletitgo_s,
    letitgoletitgo_sv
  ] = strings;

  {
    frozen::basic_string<Char> letItGo = letitgo_sv;
    REQUIRE(letItGo == letitgo);
    REQUIRE(letItGo == letitgo_s);
    REQUIRE(letItGo == letitgo_sv);

    letItGo = letitgoletitgo_sv;
    REQUIRE(letItGo == letitgoletitgo);
    REQUIRE(letItGo == letitgoletitgo_s);
    REQUIRE(letItGo == letitgoletitgo_sv);
  }

  {
    constexpr frozen::basic_string<Char> letItGo = std::get<2>(strings);
    static_assert(letItGo == std::get<0>(strings), "frozen::string constexpr");
    static_assert(letItGo == std::get<1>(strings), "frozen::string constexpr literal");
    static_assert(letItGo == std::get<2>(strings), "frozen::string constexpr string view");
  }
#endif
}